

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

bool __thiscall QMdiAreaPrivate::lastWindowAboutToBeDestroyed(QMdiAreaPrivate *this)

{
  bool bVar1;
  qsizetype qVar2;
  QWidget *this_00;
  QMdiSubWindowPrivate *pQVar3;
  QList<QPointer<QMdiSubWindow>_> *in_RDI;
  QMdiSubWindow *last;
  qsizetype in_stack_ffffffffffffffd8;
  WidgetAttribute attribute;
  bool local_1;
  
  qVar2 = QList<QPointer<QMdiSubWindow>_>::size
                    ((QList<QPointer<QMdiSubWindow>_> *)&in_RDI[0x23].d.size);
  if (qVar2 == 1) {
    QList<QPointer<QMdiSubWindow>_>::at(in_RDI,in_stack_ffffffffffffffd8);
    attribute = (WidgetAttribute)((ulong)in_RDI >> 0x20);
    this_00 = &::QPointer::operator_cast_to_QMdiSubWindow_((QPointer<QMdiSubWindow> *)0x611c3d)->
               super_QWidget;
    if (this_00 == (QWidget *)0x0) {
      local_1 = true;
    }
    else {
      bVar1 = QWidget::testAttribute(this_00,attribute);
      if (bVar1) {
        pQVar3 = QMdiSubWindow::d_func((QMdiSubWindow *)0x611c75);
        local_1 = (*(uint *)&(pQVar3->super_QWidgetPrivate).data.field_0x10 >> 9 & 1) != 0;
      }
      else {
        local_1 = false;
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool QMdiAreaPrivate::lastWindowAboutToBeDestroyed() const
{
    if (childWindows.size() != 1)
        return false;

    QMdiSubWindow *last = childWindows.at(0);
    if (!last)
        return true;

    if (!last->testAttribute(Qt::WA_DeleteOnClose))
        return false;

    return last->d_func()->data.is_closing;
}